

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O0

void ucm_printTable(UCMTable *table,FILE *f,UBool byUnicode)

{
  int iVar1;
  int32_t *piVar2;
  int32_t *map;
  int32_t length;
  int32_t i;
  UCMapping *m;
  UBool byUnicode_local;
  FILE *f_local;
  UCMTable *table_local;
  
  _length = table->mappings;
  iVar1 = table->mappingsLength;
  if (byUnicode == '\0') {
    piVar2 = table->reverseMap;
    for (map._4_4_ = 0; map._4_4_ < iVar1; map._4_4_ = map._4_4_ + 1) {
      ucm_printMapping(table,_length + piVar2[map._4_4_],f);
    }
  }
  else {
    for (map._4_4_ = 0; map._4_4_ < iVar1; map._4_4_ = map._4_4_ + 1) {
      ucm_printMapping(table,_length,f);
      _length = _length + 1;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucm_printTable(UCMTable *table, FILE *f, UBool byUnicode) {
    UCMapping *m;
    int32_t i, length;

    m=table->mappings;
    length=table->mappingsLength;
    if(byUnicode) {
        for(i=0; i<length; ++m, ++i) {
            ucm_printMapping(table, m, f);
        }
    } else {
        const int32_t *map=table->reverseMap;
        for(i=0; i<length; ++i) {
            ucm_printMapping(table, m+map[i], f);
        }
    }
}